

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall
soul::AST::Context::throwError(Context *this,CompileMessage *message,bool isStaticAssertion)

{
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  FunctionCall *pFVar3;
  Function *pFVar4;
  string *psVar5;
  SourceCodeText *pSVar6;
  CompileMessage *insertPos;
  undefined4 extraout_var_00;
  bool bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [8];
  CompileMessage error;
  Function *f;
  Scope *p;
  CodeLocation local_160;
  CompileMessage local_150;
  undefined1 local_118 [8];
  CompileMessageGroup messages;
  bool isStaticAssertion_local;
  CompileMessage *message_local;
  Context *this_local;
  
  messages.messages.space[0x1b]._7_1_ = isStaticAssertion;
  CompileMessageGroup::CompileMessageGroup((CompileMessageGroup *)local_118);
  CodeLocation::CodeLocation(&local_160,&this->location);
  CompileMessage::withLocation(&local_150,message,&local_160);
  ArrayWithPreallocation<soul::CompileMessage,_4UL>::push_back
            ((ArrayWithPreallocation<soul::CompileMessage,_4UL> *)local_118,&local_150);
  CompileMessage::~CompileMessage(&local_150);
  CodeLocation::~CodeLocation(&local_160);
  f = (Function *)this->parentScope;
  while( true ) {
    bVar7 = false;
    if (f != (Function *)0x0) {
      sVar2 = ArrayWithPreallocation<soul::CompileMessage,_4UL>::size
                        ((ArrayWithPreallocation<soul::CompileMessage,_4UL> *)local_118);
      bVar7 = sVar2 < 10;
    }
    if (!bVar7) break;
    iVar1 = (*(f->super_ASTObject)._vptr_ASTObject[8])();
    error._48_8_ = CONCAT44(extraout_var,iVar1);
    if ((error._48_8_ != 0) &&
       (bVar7 = pool_ptr<soul::AST::FunctionCall>::operator!=
                          ((pool_ptr<soul::AST::FunctionCall> *)(error._48_8_ + 0xa8),(void *)0x0),
       bVar7)) {
      pFVar3 = pool_ptr<soul::AST::FunctionCall>::operator->
                         ((pool_ptr<soul::AST::FunctionCall> *)(error._48_8_ + 0xa8));
      pFVar4 = pool_ptr<soul::AST::Function>::operator->
                         ((pool_ptr<soul::AST::Function> *)(error._48_8_ + 0xa0));
      psVar5 = Identifier::operator_cast_to_string_(&pFVar4->name);
      std::__cxx11::string::string((string *)&local_1f8,(string *)psVar5);
      CallOrCastBase::getDescription(&local_1d8,&pFVar3->super_CallOrCastBase,&local_1f8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                     "Failed to instantiate generic function ",&local_1d8);
      pFVar3 = pool_ptr<soul::AST::FunctionCall>::operator->
                         ((pool_ptr<soul::AST::FunctionCall> *)(error._48_8_ + 0xa8));
      CodeLocation::CodeLocation
                ((CodeLocation *)((long)&error.description.field_2 + 8),
                 &(pFVar3->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
                  context.location);
      error.location.location.data._0_4_ = 0;
      error.location.location.data._4_4_ = 0;
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1f8);
      pSVar6 = RefCountedPtr<soul::SourceCodeText>::operator->
                         ((RefCountedPtr<soul::SourceCodeText> *)this);
      if ((pSVar6->isInternal & 1U) == 0) {
        insertPos = ArrayWithPreallocation<soul::CompileMessage,_4UL>::begin
                              ((ArrayWithPreallocation<soul::CompileMessage,_4UL> *)local_118);
        ArrayWithPreallocation<soul::CompileMessage,_4UL>::insert
                  ((ArrayWithPreallocation<soul::CompileMessage,_4UL> *)local_118,insertPos,
                   (CompileMessage *)local_1b8);
      }
      else {
        ArrayWithPreallocation<soul::CompileMessage,_4UL>::clear
                  ((ArrayWithPreallocation<soul::CompileMessage,_4UL> *)local_118);
        if ((messages.messages.space[0x1b]._7_1_ & 1) == 0) {
          std::operator+(&local_218,", error: ",&message->description);
          std::__cxx11::string::operator+=((string *)local_1b8,(string *)&local_218);
          std::__cxx11::string::~string((string *)&local_218);
        }
        else {
          std::__cxx11::string::operator=((string *)local_1b8,(string *)message);
        }
        ArrayWithPreallocation<soul::CompileMessage,_4UL>::push_back
                  ((ArrayWithPreallocation<soul::CompileMessage,_4UL> *)local_118,
                   (CompileMessage *)local_1b8);
      }
      pFVar3 = pool_ptr<soul::AST::FunctionCall>::operator->
                         ((pool_ptr<soul::AST::FunctionCall> *)(error._48_8_ + 0xa8));
      f = (Function *)
          (pFVar3->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.context.
          parentScope;
      CompileMessage::~CompileMessage((CompileMessage *)local_1b8);
    }
    iVar1 = (*(f->super_ASTObject)._vptr_ASTObject[4])();
    f = (Function *)CONCAT44(extraout_var_00,iVar1);
  }
  soul::throwError((CompileMessageGroup *)local_118);
}

Assistant:

[[noreturn]] void throwError (CompileMessage message, bool isStaticAssertion = false) const
        {
            CompileMessageGroup messages;
            messages.messages.push_back (message.withLocation (location));

            for (auto p = parentScope; p != nullptr && messages.messages.size() < 10; p = p->getParentScope())
            {
                if (auto f = p->getAsFunction())
                {
                    if (f->originalCallLeadingToSpecialisation != nullptr)
                    {
                        CompileMessage error { "Failed to instantiate generic function "
                                                  + f->originalCallLeadingToSpecialisation->getDescription (f->originalGenericFunction->name),
                                               f->originalCallLeadingToSpecialisation->context.location,
                                               CompileMessage::Type::error };

                        if (location.sourceCode->isInternal)
                        {
                            messages.messages.clear();

                            if (isStaticAssertion)
                                error.description = message.description;
                            else
                                error.description += ", error: " + message.description;

                            messages.messages.push_back (error);
                        }
                        else
                        {
                            messages.messages.insert (messages.messages.begin(), error);
                        }

                        p = f->originalCallLeadingToSpecialisation->context.parentScope;
                    }
                }
            }

            soul::throwError (messages);
        }